

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> * __thiscall
dg::pta::PointerSubgraph::getLoop(PointerSubgraph *this,PSNode *nd)

{
  bool bVar1;
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  *this_00;
  pointer pvVar2;
  long in_RDI;
  const_iterator it;
  unordered_map<const_dg::pta::PSNode_*,_unsigned_long,_std::hash<const_dg::pta::PSNode_*>,_std::equal_to<const_dg::pta::PSNode_*>,_std::allocator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>_>_>
  *in_stack_ffffffffffffffc8;
  const_reference local_30;
  _Node_iterator_base<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>,_false> local_20;
  _Node_iterator_base<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>,_false> local_18 [3];
  
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<const_dg::pta::PSNode_*,_unsigned_long,_std::hash<const_dg::pta::PSNode_*>,_std::equal_to<const_dg::pta::PSNode_*>,_std::allocator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x1606f6);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<const_dg::pta::PSNode_*,_unsigned_long,_std::hash<const_dg::pta::PSNode_*>,_std::equal_to<const_dg::pta::PSNode_*>,_std::allocator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::__detail::operator==(local_18,&local_20);
  if (bVar1) {
    local_30 = (const_reference)0x0;
  }
  else {
    this_00 = (vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
               *)(in_RDI + 8);
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>,_false,_false>
                           *)0x160743);
    local_30 = std::
               vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
               ::operator[](this_00,pvVar2->second);
  }
  return local_30;
}

Assistant:

const std::vector<PSNode *> *getLoop(const PSNode *nd) const {
        assert(_computed_loops && "Call computeLoops() first");

        auto it = _node_to_loop.find(nd);
        assert(it == _node_to_loop.end() || it->second < _loops.size());
        return it == _node_to_loop.end() ? nullptr : &_loops[it->second];
    }